

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.h
# Opt level: O1

bool __thiscall HttpRequest::SetMethod(HttpRequest *this,char *start,char *end)

{
  int iVar1;
  Method MVar2;
  string temp_method;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (this->_method == Invalid) {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40);
    iVar1 = std::__cxx11::string::compare((char *)local_40);
    if (iVar1 == 0) {
      MVar2 = Get;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)local_40);
      if (iVar1 == 0) {
        MVar2 = Post;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)local_40);
        if (iVar1 == 0) {
          MVar2 = Head;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)local_40);
          if (iVar1 == 0) {
            MVar2 = Put;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)local_40);
            MVar2 = (uint)(iVar1 == 0) * 5;
          }
        }
      }
    }
    this->_method = MVar2;
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
    return MVar2 != Invalid;
  }
  __assert_fail("_method == Invalid",
                "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/test/http/http_request.h"
                ,0x29,"bool HttpRequest::SetMethod(const char *, const char *)");
}

Assistant:

bool SetMethod(const char* start, const char* end) {
    assert(_method == Invalid);
    std::string temp_method(start, end);
    if (temp_method == "GET") {
      _method = Get;

    } else if (temp_method == "POST") {
      _method = Post;

    } else if (temp_method == "HEAD") {
      _method = Head;

    } else if (temp_method == "PUT") {
      _method = Put;

    } else if (temp_method == "DELETE") {
      _method = Delete;

    } else {
      _method = Invalid;
    }
    return _method != Invalid;
  }